

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highwayhash.cpp
# Opt level: O2

void __thiscall groundupdbext::HighwayHash::HighwayHash(HighwayHash *this)

{
  HighwayHashCatT<1U> *this_00;
  HHResult64 *pHVar1;
  
  this->m_key[2] = 3;
  this->m_key[3] = 4;
  *(undefined4 *)this->m_key = 1;
  *(undefined4 *)((long)this->m_key + 4) = 0;
  *(undefined4 *)(this->m_key + 1) = 2;
  *(undefined4 *)((long)this->m_key + 0xc) = 0;
  this_00 = (HighwayHashCatT<1U> *)operator_new(0xc0,0x40);
  highwayhash::HighwayHashCatT<1U>::HighwayHashCatT(this_00,this->m_key);
  this->m_hh = this_00;
  pHVar1 = (HHResult64 *)operator_new(8);
  *pHVar1 = 0;
  this->m_result = pHVar1;
  return;
}

Assistant:

HighwayHash::HighwayHash()
  : m_key{1,2,3,4},
    m_hh(new HighwayHashCatT<HH_TARGET>(m_key)),
    m_result(new HHResult64())
{
  ;
}